

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O2

bool btGeometryUtil::areVerticesBehindPlane
               (btVector3 *planeNormal,btAlignedObjectArray<btVector3> *vertices,btScalar margin)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  btScalar bVar6;
  
  uVar1 = vertices->m_size;
  lVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (uVar5 == uVar3) break;
    bVar6 = btVector3::dot(planeNormal,(btVector3 *)((long)vertices->m_data->m_floats + lVar4));
    lVar4 = lVar4 + 0x10;
    uVar2 = uVar3 + 1;
  } while (bVar6 + planeNormal->m_floats[3] <= margin);
  return (long)(int)uVar1 <= (long)uVar3;
}

Assistant:

bool	btGeometryUtil::areVerticesBehindPlane(const btVector3& planeNormal, const btAlignedObjectArray<btVector3>& vertices, btScalar	margin)
{
	int numvertices = vertices.size();
	for (int i=0;i<numvertices;i++)
	{
		const btVector3& N1 = vertices[i];
		btScalar dist = btScalar(planeNormal.dot(N1))+btScalar(planeNormal[3])-margin;
		if (dist>btScalar(0.))
		{
			return false;
		}
	}
	return true;
}